

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O3

int * Abc_NamStrHashFind(Abc_Nam_t *p,char *pStr,char *pLim)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  
  piVar4 = p->pBins;
  iVar5 = Abc_NamStrHash(pStr,pLim,p->nBins);
  if (*pStr == '\0') {
    __assert_fail("*pStr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilNam.c"
                  ,0x14b,"int *Abc_NamStrHashFind(Abc_Nam_t *, const char *, const char *)");
  }
  puVar6 = (uint *)(piVar4 + iVar5);
  uVar3 = *puVar6;
  uVar7 = (ulong)uVar3;
  if (uVar7 != 0) {
    if (((int)uVar3 < 0) || ((p->vInt2Handle).nSize <= (int)uVar3)) {
LAB_001cda51:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (p->pStore != (char *)0x0) {
      pcVar8 = p->pStore + (p->vInt2Handle).pArray[uVar7];
LAB_001cd9ca:
      pcVar9 = pStr;
      if (pLim == (char *)0x0) {
        do {
          cVar1 = *pcVar9;
          if (cVar1 == '\0') goto LAB_001cda07;
          pcVar9 = pcVar9 + 1;
          cVar2 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar1 == cVar2);
      }
      else {
        do {
          if (pLim <= pcVar9) goto LAB_001cda07;
          cVar1 = *pcVar9;
          pcVar9 = pcVar9 + 1;
          cVar2 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar1 == cVar2);
      }
      goto LAB_001cda0c;
    }
  }
  return (int *)puVar6;
LAB_001cda07:
  if (*pcVar8 == '\0') {
    return (int *)puVar6;
  }
LAB_001cda0c:
  if (((int)uVar7 < 0) || ((p->vInt2Next).nSize <= (int)uVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  puVar6 = (uint *)((p->vInt2Next).pArray + uVar7);
  uVar3 = *puVar6;
  uVar7 = (ulong)uVar3;
  if (uVar7 == 0) {
    return (int *)puVar6;
  }
  if (((int)uVar3 < 0) || ((p->vInt2Handle).nSize <= (int)uVar3)) goto LAB_001cda51;
  pcVar8 = p->pStore + (p->vInt2Handle).pArray[uVar7];
  if (p->pStore == (char *)0x0) {
    return (int *)puVar6;
  }
  goto LAB_001cd9ca;
}

Assistant:

static inline int * Abc_NamStrHashFind( Abc_Nam_t * p, const char * pStr, const char * pLim )
{
    char * pThis;
    int * pPlace = (int *)(p->pBins + Abc_NamStrHash( pStr, pLim, p->nBins ));
    assert( *pStr );
    for ( pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL; 
          pThis;    pPlace = Abc_NamIntToNextP(p, *pPlace), 
          pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL )
              if ( !Abc_NamStrcmp( (char *)pStr, (char *)pLim, pThis ) )
                  break;
    return pPlace;
}